

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_insert.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformValuesList(Transformer *this,PGList *list)

{
  pointer pEVar1;
  reference pvVar2;
  ParserException *this_00;
  long in_RDX;
  pointer *__ptr;
  undefined8 *puVar3;
  optional_ptr<duckdb_libpgquery::PGList,_true> target;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  insert_values;
  _Head_base<0UL,_duckdb::ExpressionListRef_*,_false> local_78;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_70;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_68;
  string local_50;
  
  local_78._M_head_impl = (ExpressionListRef *)operator_new(0xb0);
  *(undefined1 *)&((Transformer *)local_78._M_head_impl)->options = 6;
  ((Transformer *)local_78._M_head_impl)->prepared_statement_parameter_index =
       (idx_t)&(((Transformer *)local_78._M_head_impl)->named_param_map)._M_h._M_bucket_count;
  (((Transformer *)local_78._M_head_impl)->named_param_map)._M_h._M_buckets = (__buckets_ptr)0x0;
  *(undefined1 *)&(((Transformer *)local_78._M_head_impl)->named_param_map)._M_h._M_bucket_count = 0
  ;
  (((Transformer *)local_78._M_head_impl)->named_param_map)._M_h._M_element_count = 0;
  *(undefined8 *)
   &(((Transformer *)local_78._M_head_impl)->named_param_map)._M_h._M_rehash_policy.
    _M_max_load_factor = 0xffffffffffffffff;
  (((Transformer *)local_78._M_head_impl)->named_param_map)._M_h._M_rehash_policy._M_next_resize = 0
  ;
  (((Transformer *)local_78._M_head_impl)->named_param_map)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  *(undefined8 *)&((Transformer *)local_78._M_head_impl)->last_param_type = 0;
  (((Transformer *)local_78._M_head_impl)->window_clauses)._M_h._M_buckets = (__buckets_ptr)0x0;
  (((Transformer *)local_78._M_head_impl)->window_clauses)._M_h._M_bucket_count = 0;
  (((Transformer *)local_78._M_head_impl)->parent).ptr =
       (Transformer *)&PTR__ExpressionListRef_0243c160;
  (((Transformer *)local_78._M_head_impl)->window_clauses)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (((Transformer *)local_78._M_head_impl)->window_clauses)._M_h._M_element_count = 0;
  *(undefined8 *)&(((Transformer *)local_78._M_head_impl)->window_clauses)._M_h._M_rehash_policy = 0
  ;
  (((Transformer *)local_78._M_head_impl)->window_clauses)._M_h._M_rehash_policy._M_next_resize = 0;
  (((Transformer *)local_78._M_head_impl)->window_clauses)._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  (((Transformer *)local_78._M_head_impl)->pivot_entries).
  super_vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((Transformer *)local_78._M_head_impl)->pivot_entries).
  super_vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((Transformer *)local_78._M_head_impl)->pivot_entries).
  super_vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((Transformer *)local_78._M_head_impl)->stored_cte_map).
  super_vector<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
  .
  super__Vector_base<duckdb::CommonTableExpressionMap_*,_std::allocator<duckdb::CommonTableExpressionMap_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  puVar3 = *(undefined8 **)(in_RDX + 8);
  if (puVar3 != (undefined8 *)0x0) {
    do {
      local_70.ptr = (PGList *)*puVar3;
      local_68.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid(&local_70);
      TransformExpressionList
                ((Transformer *)list,local_70.ptr,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&local_68);
      pEVar1 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                             *)&local_78);
      if ((pEVar1->values).
          super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
          .
          super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pEVar1->values).
          super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
          .
          super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pEVar1 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                 ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                               *)&local_78);
        pvVar2 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                 ::operator[](&pEVar1->values,0);
        if ((long)(pvVar2->
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar2->
                  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ).
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
            (long)local_68.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_68.
                  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
          this_00 = (ParserException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"VALUES lists must all be the same length","");
          ParserException::ParserException(this_00,&local_50);
          __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      pEVar1 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
               ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                             *)&local_78);
      ::std::
      vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
      ::
      emplace_back<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>>
                  *)&pEVar1->values,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&local_68);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_68);
      puVar3 = (undefined8 *)puVar3[1];
    } while (puVar3 != (undefined8 *)0x0);
  }
  pEVar1 = unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
           ::operator->((unique_ptr<duckdb::ExpressionListRef,_std::default_delete<duckdb::ExpressionListRef>,_true>
                         *)&local_78);
  ::std::__cxx11::string::_M_replace
            ((ulong)&(pEVar1->super_TableRef).alias,0,
             (char *)(pEVar1->super_TableRef).alias._M_string_length,0x1d97b30);
  (this->parent).ptr = (Transformer *)local_78._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformValuesList(duckdb_libpgquery::PGList *list) {
	auto result = make_uniq<ExpressionListRef>();
	for (auto value_list = list->head; value_list != nullptr; value_list = value_list->next) {
		auto target = PGPointerCast<duckdb_libpgquery::PGList>(value_list->data.ptr_value);

		vector<unique_ptr<ParsedExpression>> insert_values;
		TransformExpressionList(*target, insert_values);
		if (!result->values.empty()) {
			if (result->values[0].size() != insert_values.size()) {
				throw ParserException("VALUES lists must all be the same length");
			}
		}
		result->values.push_back(std::move(insert_values));
	}
	result->alias = "valueslist";
	return std::move(result);
}